

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void uv__run_timers(uv_loop_t *loop)

{
  undefined8 *puVar1;
  long lVar2;
  uint64_t timeout;
  long *plVar3;
  uv_timer_cb cb;
  undefined8 *puVar4;
  long *local_28;
  undefined8 *local_20;
  
  local_20 = &local_28;
  local_28 = (long *)&local_28;
  puVar1 = (undefined8 *)(loop->timer_heap).min;
  if (puVar1 != (undefined8 *)0x0) {
    do {
      puVar4 = puVar1;
      if (loop->time < (ulong)puVar4[3]) break;
      uv_timer_stop((uv_timer_t *)(puVar4 + -9));
      *puVar4 = &local_28;
      puVar4[1] = local_20;
      *local_20 = puVar4;
      puVar1 = (undefined8 *)(loop->timer_heap).min;
      local_20 = puVar4;
    } while (puVar1 != (undefined8 *)0x0);
    while (plVar3 = local_28, (long **)local_28 != &local_28) {
      lVar2 = *local_28;
      *(long *)local_28[1] = lVar2;
      *(long *)(lVar2 + 8) = local_28[1];
      *local_28 = (long)local_28;
      plVar3[1] = (long)plVar3;
      cb = (uv_timer_cb)plVar3[-1];
      timeout = plVar3[4];
      if (timeout != 0) {
        uv_timer_start((uv_timer_t *)(plVar3 + -9),cb,timeout,timeout);
        cb = (uv_timer_cb)plVar3[-1];
      }
      (*cb)((uv_timer_t *)(plVar3 + -9));
    }
  }
  return;
}

Assistant:

void uv__run_timers(uv_loop_t* loop) {
  struct heap_node* heap_node;
  uv_timer_t* handle;
  struct uv__queue* queue_node;
  struct uv__queue ready_queue;

  uv__queue_init(&ready_queue);

  for (;;) {
    heap_node = heap_min((struct heap*) &loop->timer_heap);
    if (heap_node == NULL)
      break;

    handle = container_of(heap_node, uv_timer_t, node.heap);
    if (handle->timeout > loop->time)
      break;

    uv_timer_stop(handle);
    uv__queue_insert_tail(&ready_queue, &handle->node.queue);
  }

  while (!uv__queue_empty(&ready_queue)) {
    queue_node = uv__queue_head(&ready_queue);
    uv__queue_remove(queue_node);
    uv__queue_init(queue_node);
    handle = container_of(queue_node, uv_timer_t, node.queue);

    uv_timer_again(handle);
    handle->timer_cb(handle);
  }
}